

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

ConditionCode arm::reverse_cond(ConditionCode cond)

{
  ConditionCode cond_local;
  ConditionCode local_1;
  
  local_1 = cond;
  switch(cond) {
  case Equal:
  case NotEqual:
  case CarrySet:
  case CarryClear:
  case MinusOrNegative:
  case PositiveOrZero:
  case Overflow:
  case NoOverflow:
  case Always:
    break;
  case UnsignedGe:
    local_1 = UnsignedLe;
    break;
  case UnsignedLt:
    local_1 = UnsignedGt;
    break;
  case UnsignedGt:
    local_1 = UnsignedLt;
    break;
  case UnsignedLe:
    local_1 = UnsignedGe;
    break;
  case Ge:
    local_1 = Le;
    break;
  case Lt:
    local_1 = Gt;
    break;
  case Gt:
    local_1 = Lt;
    break;
  case Le:
    local_1 = Ge;
  }
  return local_1;
}

Assistant:

ConditionCode reverse_cond(ConditionCode cond) {
  switch (cond) {
    case ConditionCode::Equal:
    case ConditionCode::NotEqual:
    case ConditionCode::CarrySet:
    case ConditionCode::CarryClear:
    case ConditionCode::MinusOrNegative:
    case ConditionCode::PositiveOrZero:
    case ConditionCode::Overflow:
    case ConditionCode::NoOverflow:
    case ConditionCode::Always:
      return cond;

    case ConditionCode::UnsignedGe:
      return ConditionCode::UnsignedLe;
    case ConditionCode::UnsignedLt:
      return ConditionCode::UnsignedGt;
    case ConditionCode::UnsignedGt:
      return ConditionCode::UnsignedLt;
    case ConditionCode::UnsignedLe:
      return ConditionCode::UnsignedGe;

    case ConditionCode::Ge:
      return ConditionCode::Le;
    case ConditionCode::Lt:
      return ConditionCode::Gt;
    case ConditionCode::Gt:
      return ConditionCode::Lt;
    case ConditionCode::Le:
      return ConditionCode::Ge;
    default:
      return cond;
  }
}